

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::setInputWidget(QInputDialogPrivate *this,QWidget *widget)

{
  QAbstractSpinBox *pQVar1;
  QWidget *in_RSI;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBox *spinBox;
  QAbstractSpinBox *spinBox_1;
  QAbstractButton *okButton;
  QString *in_stack_ffffffffffffff98;
  QInputDialogPrivate *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QInputDialogPrivate *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffb8;
  StandardButton which;
  undefined8 in_stack_ffffffffffffffc8;
  int stretch;
  QWidget *in_stack_ffffffffffffffd0;
  QInputDialogPrivate *in_stack_ffffffffffffffd8;
  int index;
  QInputDialogPrivate *pQVar2;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  undefined1 local_c [4];
  long local_8;
  
  stretch = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->inputWidget != in_RSI) {
    if (in_RDI->mainLayout != (QVBoxLayout *)0x0) {
      pQVar2 = in_RDI;
      QLayout::removeWidget
                ((QLayout *)in_stack_ffffffffffffffb8,(QWidget *)in_stack_ffffffffffffffb0);
      alignment.i = (Int)((ulong)pQVar2 >> 0x20);
      index = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
      in_stack_ffffffffffffffb8 = in_RSI;
      QWidget::hide((QWidget *)0x79b709);
      in_stack_ffffffffffffffb0 = (QInputDialogPrivate *)in_RDI->mainLayout;
      in_RSI = in_stack_ffffffffffffffb8;
      memset(local_c,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x79b73f);
      QBoxLayout::insertWidget
                ((QBoxLayout *)in_RSI,index,in_stack_ffffffffffffffd0,stretch,(Alignment)alignment.i
                );
      QWidget::show((QWidget *)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffa0 =
           (QInputDialogPrivate *)
           QDialogButtonBox::button
                     ((QDialogButtonBox *)in_RDI,
                      (StandardButton)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      in_stack_ffffffffffffffd0 =
           &qobject_cast<QAbstractSpinBox*>((QObject *)0x79b793)->super_QWidget;
      if (in_stack_ffffffffffffffd0 != (QWidget *)0x0) {
        QObject::disconnect(&in_stack_ffffffffffffffd0->super_QObject,"2textChanged(bool)",
                            (QObject *)in_stack_ffffffffffffffa0,"1setEnabled(bool)");
      }
      pQVar1 = qobject_cast<QAbstractSpinBox*>((QObject *)0x79b7c7);
      ensureEnabledConnection
                (in_stack_ffffffffffffffb0,
                 (QAbstractSpinBox *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffaf = true;
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffa0;
      if (pQVar1 != (QAbstractSpinBox *)0x0) {
        in_stack_ffffffffffffffaf =
             QAbstractSpinBox::hasAcceptableInput((QAbstractSpinBox *)in_stack_ffffffffffffffa0);
      }
      QWidget::setEnabled((QWidget *)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
    }
    in_RDI->inputWidget = in_RSI;
    if (in_RSI == &in_RDI->lineEdit->super_QWidget) {
      QLineEdit::setText((QLineEdit *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else if (in_RSI == (QWidget *)in_RDI->plainTextEdit) {
      QPlainTextEdit::setPlainText
                ((QPlainTextEdit *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else if (in_RSI == &in_RDI->comboBox->super_QWidget) {
      setComboBoxText(in_RDI,(QString *)in_stack_ffffffffffffffb8);
    }
    else if (in_RSI == (QWidget *)in_RDI->listView) {
      setListViewText(in_stack_ffffffffffffffd8,(QString *)in_stack_ffffffffffffffd0);
      which = (StandardButton)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      ensureLayout((QInputDialogPrivate *)spinBox_1);
      QDialogButtonBox::button((QDialogButtonBox *)in_RDI,which);
      QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffffa0);
      QItemSelectionModel::hasSelection();
      QWidget::setEnabled((QWidget *)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDialogPrivate::setInputWidget(QWidget *widget)
{
    Q_ASSERT(widget);
    if (inputWidget == widget)
        return;

    if (mainLayout) {
        Q_ASSERT(inputWidget);
        mainLayout->removeWidget(inputWidget);
        inputWidget->hide();
        mainLayout->insertWidget(1, widget);
        widget->show();

        // disconnect old input widget
        QAbstractButton *okButton = buttonBox->button(QDialogButtonBox::Ok);
        if (QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(inputWidget))
            QObject::disconnect(spinBox, SIGNAL(textChanged(bool)), okButton, SLOT(setEnabled(bool)));

        // connect new input widget and update enabled state of OK button
        QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(widget);
        ensureEnabledConnection(spinBox);
        okButton->setEnabled(!spinBox || spinBox->hasAcceptableInput());
    }

    inputWidget = widget;

    // synchronize the text shown in the new text editor with the current
    // textValue
    if (widget == lineEdit) {
        lineEdit->setText(textValue);
    } else if (widget == plainTextEdit) {
        plainTextEdit->setPlainText(textValue);
    } else if (widget == comboBox) {
        setComboBoxText(textValue);
    } else if (widget == listView) {
        setListViewText(textValue);
        ensureLayout();
        buttonBox->button(QDialogButtonBox::Ok)->setEnabled(listView->selectionModel()->hasSelection());
    }
}